

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

QPalette __thiscall QMdiSubWindowPrivate::desktopPalette(QMdiSubWindowPrivate *this)

{
  QWidget *this_00;
  QPalette *pQVar1;
  QColor *pQVar2;
  undefined8 extraout_RDX;
  long in_RSI;
  QPalette QVar3;
  
  this_00 = *(QWidget **)(in_RSI + 8);
  *(undefined1 **)&this->super_QWidgetPrivate = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QWidgetPrivate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = QWidget::palette(this_00);
  QPalette::QPalette((QPalette *)this,pQVar1);
  pQVar2 = QPalette::color((QPalette *)this,Active,Highlight);
  QPalette::setColor((QPalette *)this,Active,Highlight,pQVar2);
  pQVar2 = QPalette::color((QPalette *)this,Active,Highlight);
  QPalette::setColor((QPalette *)this,Active,Base,pQVar2);
  pQVar2 = QPalette::color((QPalette *)this,Inactive,Dark);
  QPalette::setColor((QPalette *)this,Inactive,Highlight,pQVar2);
  pQVar2 = QPalette::color((QPalette *)this,Inactive,Dark);
  QPalette::setColor((QPalette *)this,Inactive,Base,pQVar2);
  pQVar2 = QPalette::color((QPalette *)this,Inactive,Window);
  QPalette::setColor((QPalette *)this,Inactive,HighlightedText,pQVar2);
  QVar3._8_8_ = extraout_RDX;
  QVar3.d = (QPalettePrivate *)this;
  return QVar3;
}

Assistant:

QPalette QMdiSubWindowPrivate::desktopPalette() const
{
    Q_Q(const QMdiSubWindow);
    QPalette newPalette = q->palette();

    newPalette.setColor(QPalette::Active, QPalette::Highlight,
                        newPalette.color(QPalette::Active, QPalette::Highlight));
    newPalette.setColor(QPalette::Active, QPalette::Base,
                        newPalette.color(QPalette::Active, QPalette::Highlight));
    newPalette.setColor(QPalette::Inactive, QPalette::Highlight,
                        newPalette.color(QPalette::Inactive, QPalette::Dark));
    newPalette.setColor(QPalette::Inactive, QPalette::Base,
                        newPalette.color(QPalette::Inactive, QPalette::Dark));
    newPalette.setColor(QPalette::Inactive, QPalette::HighlightedText,
                        newPalette.color(QPalette::Inactive, QPalette::Window));

    return newPalette;
}